

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

void capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::set
               (PointerBuilder builder,Reader *value)

{
  Reader local_40;
  
  Schema::getProto(&local_40,(Schema *)value);
  if ((0xe0 < local_40._reader.dataSize) &&
     ((*(byte *)((long)local_40._reader.data + 0x1c) & 1) != 0)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              ((Fault *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x768,FAILED,"!value.schema.getProto().getStruct().getIsGroup()",
               "\"Cannot form pointer to group type.\"",
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal((Fault *)&local_40);
  }
  PointerBuilder::setStruct(&builder,&value->reader,false);
  return;
}

Assistant:

void PointerHelpers<DynamicStruct, Kind::OTHER>::set(
    PointerBuilder builder, const DynamicStruct::Reader& value) {
  KJ_REQUIRE(!value.schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  builder.setStruct(value.reader);
}